

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O3

int __thiscall Imf_3_4::Image::levelHeight(Image *this,int ly)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  ArgExc *this_00;
  int iVar4;
  stringstream _iex_throw_s;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  if ((-1 < ly) && (ly < (int)(this->_levels)._sizeX)) {
    iVar2 = (this->_dataWindow).max.y;
    iVar1 = (this->_dataWindow).min.y;
    iVar4 = iVar2 - iVar1;
    if (iVar2 < iVar1) {
      iVar2 = 0;
    }
    else {
      iVar2 = (iVar4 + 1) / (1 << ((byte)ly & 0x1f));
      iVar2 = iVar2 + (uint)(iVar2 << ((byte)ly & 0x1f) <= iVar4 &&
                            this->_levelRoundingMode == ROUND_UP);
      if (iVar2 < 2) {
        iVar2 = 1;
      }
    }
    return iVar2;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_188,"Cannot get level height for invalid image level number ",0x37);
  poVar3 = (ostream *)std::ostream::operator<<(local_188,ly);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,".",1);
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,asStack_198);
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

int
Image::levelHeight (int ly) const
{
    if (ly < 0 || ly >= numYLevels ())
    {
        THROW (
            ArgExc,
            "Cannot get level height for invalid "
            "image level number "
                << ly << ".");
    }

    return levelSize (
        _dataWindow.min.y, _dataWindow.max.y, ly, _levelRoundingMode);
}